

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

real __thiscall fasttext::Model::binaryLogistic(Model *this,int32_t target,bool label,real lr)

{
  float a;
  undefined7 in_register_00000011;
  long i;
  undefined1 auVar1 [16];
  real rVar2;
  undefined1 auVar3 [64];
  undefined1 extraout_var [56];
  
  i = (long)target;
  rVar2 = Matrix::dotRow((this->wo_).
                         super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         &this->hidden_,i);
  rVar2 = utils::sigmoid(rVar2);
  a = ((float)(int)CONCAT71(in_register_00000011,label) - rVar2) * lr;
  Vector::addRow(&this->grad_,
                 (this->wo_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 ,i,a);
  Matrix::addRow((this->wo_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 ,&this->hidden_,i,a);
  auVar3._0_8_ = utils::log((double)(ulong)((uint)label * (int)rVar2 +
                                           (uint)!label * (int)(1.0 - rVar2)));
  auVar3._8_56_ = extraout_var;
  auVar1._8_4_ = 0x80000000;
  auVar1._0_8_ = 0x8000000080000000;
  auVar1._12_4_ = 0x80000000;
  auVar1 = vxorps_avx512vl(auVar3._0_16_,auVar1);
  return auVar1._0_4_;
}

Assistant:

real Model::binaryLogistic(int32_t target, bool label, real lr) {
  real score = utils::sigmoid(wo_->dotRow(hidden_, target));
  real alpha = lr * (real(label) - score);
  grad_.addRow(*wo_, target, alpha);
  wo_->addRow(hidden_, target, alpha);
  if (label) {
    return -utils::log(score);
  } else {
    return -utils::log(1.0 - score);
  }
}